

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::timer_list_engine(timer_list_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                    *this,function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *error_logger,function<void_(const_std::exception_&)> *exception_handler)

{
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_30,error_logger);
  std::function<void_(const_std::exception_&)>::function
            ((function<void_(const_std::exception_&)> *)&local_50,exception_handler);
  engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::engine_common(&this->
                   super_engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                  ,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_30,(function<void_(const_std::exception_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  this->m_head = (timer_type *)0x0;
  this->m_tail = (timer_type *)0x0;
  return;
}

Assistant:

timer_list_engine(
		//! An error logger for timer thread.
		ERROR_LOGGER error_logger,
		//! An actor exception handler for timer thread.
		ACTOR_EXCEPTION_HANDLER exception_handler )
		:	base_type( error_logger, exception_handler )
	{
	}